

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChPointPointShape.cpp
# Opt level: O1

void __thiscall
chrono::ChPointPointShape::Update
          (ChPointPointShape *this,ChPhysicsItem *updater,ChFrame<double> *frame)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  long lVar19;
  _func_int **pp_Var20;
  long lVar21;
  ChVector<double> *pCVar22;
  ChVector<double> *pCVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  ChVector<double> pt2;
  ChVector<double> pt1;
  ChVector<double> local_90;
  ChVector<double> local_78;
  ChVector<double> local_60;
  ChVector<double> local_48;
  
  if (updater == (ChPhysicsItem *)0x0) {
    lVar19 = 0;
  }
  else {
    lVar19 = __dynamic_cast(updater,&ChPhysicsItem::typeinfo,&ChLinkMarkers::typeinfo,0);
  }
  if (lVar19 == 0) {
    if (updater == (ChPhysicsItem *)0x0) {
      lVar19 = 0;
    }
    else {
      lVar19 = __dynamic_cast(updater,&ChPhysicsItem::typeinfo,&ChLinkDistance::typeinfo,0);
    }
    if (lVar19 == 0) {
      if (updater == (ChPhysicsItem *)0x0) {
        lVar19 = 0;
      }
      else {
        lVar19 = __dynamic_cast(updater,&ChPhysicsItem::typeinfo,&ChLinkRevoluteSpherical::typeinfo,
                                0);
      }
      if (lVar19 == 0) {
        if (updater == (ChPhysicsItem *)0x0) {
          lVar19 = 0;
        }
        else {
          lVar19 = __dynamic_cast(updater,&ChPhysicsItem::typeinfo,&ChLinkTSDA::typeinfo,0);
        }
        if (lVar19 == 0) {
          if (updater == (ChPhysicsItem *)0x0) {
            lVar19 = 0;
          }
          else {
            lVar19 = __dynamic_cast(updater,&ChPhysicsItem::typeinfo,&ChLinkMateGeneric::typeinfo,0)
            ;
          }
          if (lVar19 == 0) {
            if (updater == (ChPhysicsItem *)0x0) {
              lVar19 = 0;
            }
            else {
              lVar19 = __dynamic_cast(updater,&ChPhysicsItem::typeinfo,&ChLink::typeinfo,0);
            }
            if (lVar19 == 0) {
              return;
            }
            pCVar22 = &local_78;
            ChTransform<double>::TransformParentToLocal
                      ((ChVector<double> *)(*(long *)(lVar19 + 0x78) + 8),&(frame->coord).pos,
                       &frame->Amatrix);
            pCVar23 = &local_90;
            ChTransform<double>::TransformParentToLocal
                      ((ChVector<double> *)(*(long *)(lVar19 + 0x80) + 8),&(frame->coord).pos,
                       &frame->Amatrix);
            pp_Var20 = (this->super_ChLineShape).super_ChVisualShape._vptr_ChVisualShape;
          }
          else {
            ChTransform<double>::TransformLocalToParent
                      ((ChVector<double> *)(lVar19 + 0xc0),
                       (ChVector<double> *)(*(long *)(lVar19 + 0x78) + 8),
                       (ChMatrix33<double> *)(*(long *)(lVar19 + 0x78) + 0x40));
            ChTransform<double>::TransformLocalToParent
                      ((ChVector<double> *)(lVar19 + 0x148),
                       (ChVector<double> *)(*(long *)(lVar19 + 0x80) + 8),
                       (ChMatrix33<double> *)(*(long *)(lVar19 + 0x80) + 0x40));
            pCVar22 = &local_48;
            ChTransform<double>::TransformParentToLocal
                      (&local_78,&(frame->coord).pos,&frame->Amatrix);
            pCVar23 = &local_60;
            ChTransform<double>::TransformParentToLocal
                      (&local_90,&(frame->coord).pos,&frame->Amatrix);
            pp_Var20 = (this->super_ChLineShape).super_ChVisualShape._vptr_ChVisualShape;
          }
        }
        else {
          pCVar22 = &local_78;
          ChTransform<double>::TransformParentToLocal
                    ((ChVector<double> *)(lVar19 + 0xe8),&(frame->coord).pos,&frame->Amatrix);
          pCVar23 = &local_90;
          ChTransform<double>::TransformParentToLocal
                    ((ChVector<double> *)(lVar19 + 0x100),&(frame->coord).pos,&frame->Amatrix);
          pp_Var20 = (this->super_ChLineShape).super_ChVisualShape._vptr_ChVisualShape;
        }
        goto LAB_00843db8;
      }
      ChTransform<double>::TransformLocalToParent
                ((ChVector<double> *)(lVar19 + 0xb8),
                 (ChVector<double> *)(*(long *)(lVar19 + 0x78) + 8),
                 (ChMatrix33<double> *)(*(long *)(lVar19 + 0x78) + 0x40));
      local_90.m_data[0] = local_90.m_data[0] - (frame->coord).pos.m_data[0];
      local_90.m_data[1] = local_90.m_data[1] - (frame->coord).pos.m_data[1];
      local_90.m_data[2] = local_90.m_data[2] - (frame->coord).pos.m_data[2];
      auVar16._8_8_ = 0;
      auVar16._0_8_ =
           (frame->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
      auVar26._8_8_ = 0;
      auVar26._0_8_ = local_90.m_data[0];
      auVar40._8_8_ = 0;
      auVar40._0_8_ =
           local_90.m_data[1] *
           (frame->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
      auVar16 = vfmadd231sd_fma(auVar40,auVar26,auVar16);
      auVar17._8_8_ = 0;
      auVar17._0_8_ =
           (frame->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
      auVar35._8_8_ = 0;
      auVar35._0_8_ = local_90.m_data[2];
      auVar16 = vfmadd231sd_fma(auVar16,auVar35,auVar17);
      auVar18._8_8_ = 0;
      auVar18._0_8_ =
           (frame->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
      auVar43._8_8_ = 0;
      auVar43._0_8_ =
           local_90.m_data[1] *
           (frame->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
      auVar17 = vfmadd231sd_fma(auVar43,auVar26,auVar18);
      auVar7._8_8_ = 0;
      auVar7._0_8_ = (frame->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[7];
      auVar17 = vfmadd231sd_fma(auVar17,auVar35,auVar7);
      auVar8._8_8_ = 0;
      auVar8._0_8_ = (frame->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[2];
      auVar27._8_8_ = 0;
      auVar27._0_8_ = local_90.m_data[0];
      auVar31._8_8_ = 0;
      auVar31._0_8_ =
           local_90.m_data[1] *
           (frame->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
      auVar18 = vfmadd231sd_fma(auVar31,auVar27,auVar8);
      auVar9._8_8_ = 0;
      auVar9._0_8_ = (frame->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[8];
      auVar36._8_8_ = 0;
      auVar36._0_8_ = local_90.m_data[2];
      auVar18 = vfmadd231sd_fma(auVar18,auVar36,auVar9);
      local_78.m_data[0] = auVar16._0_8_;
      local_78.m_data[1] = auVar17._0_8_;
      local_78.m_data[2] = auVar18._0_8_;
      lVar21 = *(long *)(lVar19 + 0x80);
      pCVar23 = (ChVector<double> *)(lVar19 + 0xd0);
    }
    else {
      ChTransform<double>::TransformLocalToParent
                ((ChVector<double> *)(lVar19 + 200),
                 (ChVector<double> *)(*(long *)(lVar19 + 0x78) + 8),
                 (ChMatrix33<double> *)(*(long *)(lVar19 + 0x78) + 0x40));
      local_90.m_data[0] = local_90.m_data[0] - (frame->coord).pos.m_data[0];
      local_90.m_data[1] = local_90.m_data[1] - (frame->coord).pos.m_data[1];
      local_90.m_data[2] = local_90.m_data[2] - (frame->coord).pos.m_data[2];
      auVar1._8_8_ = 0;
      auVar1._0_8_ = (frame->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[0];
      auVar24._8_8_ = 0;
      auVar24._0_8_ = local_90.m_data[0];
      auVar39._8_8_ = 0;
      auVar39._0_8_ =
           local_90.m_data[1] *
           (frame->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
      auVar16 = vfmadd231sd_fma(auVar39,auVar24,auVar1);
      auVar2._8_8_ = 0;
      auVar2._0_8_ = (frame->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[6];
      auVar33._8_8_ = 0;
      auVar33._0_8_ = local_90.m_data[2];
      auVar16 = vfmadd231sd_fma(auVar16,auVar33,auVar2);
      auVar3._8_8_ = 0;
      auVar3._0_8_ = (frame->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[1];
      auVar42._8_8_ = 0;
      auVar42._0_8_ =
           local_90.m_data[1] *
           (frame->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
      auVar17 = vfmadd231sd_fma(auVar42,auVar24,auVar3);
      auVar4._8_8_ = 0;
      auVar4._0_8_ = (frame->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[7];
      auVar17 = vfmadd231sd_fma(auVar17,auVar33,auVar4);
      auVar5._8_8_ = 0;
      auVar5._0_8_ = (frame->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[2];
      auVar25._8_8_ = 0;
      auVar25._0_8_ = local_90.m_data[0];
      auVar30._8_8_ = 0;
      auVar30._0_8_ =
           local_90.m_data[1] *
           (frame->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
      auVar18 = vfmadd231sd_fma(auVar30,auVar25,auVar5);
      auVar6._8_8_ = 0;
      auVar6._0_8_ = (frame->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[8];
      auVar34._8_8_ = 0;
      auVar34._0_8_ = local_90.m_data[2];
      auVar18 = vfmadd231sd_fma(auVar18,auVar34,auVar6);
      local_78.m_data[0] = auVar16._0_8_;
      local_78.m_data[1] = auVar17._0_8_;
      local_78.m_data[2] = auVar18._0_8_;
      lVar21 = *(long *)(lVar19 + 0x80);
      pCVar23 = (ChVector<double> *)(lVar19 + 0xe0);
    }
    pCVar22 = &local_78;
    ChTransform<double>::TransformLocalToParent
              (pCVar23,(ChVector<double> *)(lVar21 + 8),(ChMatrix33<double> *)(lVar21 + 0x40));
    local_60.m_data[0] = local_60.m_data[0] - (frame->coord).pos.m_data[0];
    local_60.m_data[1] = local_60.m_data[1] - (frame->coord).pos.m_data[1];
    local_60.m_data[2] = local_60.m_data[2] - (frame->coord).pos.m_data[2];
    auVar10._8_8_ = 0;
    auVar10._0_8_ =
         (frame->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    auVar28._8_8_ = 0;
    auVar28._0_8_ = local_60.m_data[0];
    auVar41._8_8_ = 0;
    auVar41._0_8_ =
         local_60.m_data[1] *
         (frame->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    auVar16 = vfmadd231sd_fma(auVar41,auVar28,auVar10);
    auVar11._8_8_ = 0;
    auVar11._0_8_ =
         (frame->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
    auVar37._8_8_ = 0;
    auVar37._0_8_ = local_60.m_data[2];
    auVar16 = vfmadd231sd_fma(auVar16,auVar37,auVar11);
    auVar12._8_8_ = 0;
    auVar12._0_8_ =
         (frame->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    auVar44._8_8_ = 0;
    auVar44._0_8_ =
         local_60.m_data[1] *
         (frame->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
    auVar17 = vfmadd231sd_fma(auVar44,auVar28,auVar12);
    auVar13._8_8_ = 0;
    auVar13._0_8_ =
         (frame->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
    auVar17 = vfmadd231sd_fma(auVar17,auVar37,auVar13);
    auVar14._8_8_ = 0;
    auVar14._0_8_ =
         (frame->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    auVar29._8_8_ = 0;
    auVar29._0_8_ = local_60.m_data[0];
    auVar32._8_8_ = 0;
    auVar32._0_8_ =
         local_60.m_data[1] *
         (frame->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
    auVar18 = vfmadd231sd_fma(auVar32,auVar29,auVar14);
    auVar15._8_8_ = 0;
    auVar15._0_8_ =
         (frame->Amatrix).super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
    auVar38._8_8_ = 0;
    auVar38._0_8_ = local_60.m_data[2];
    auVar18 = vfmadd231sd_fma(auVar18,auVar38,auVar15);
    pCVar23 = &local_48;
    local_48.m_data[0] = auVar16._0_8_;
    local_48.m_data[1] = auVar17._0_8_;
    local_48.m_data[2] = auVar18._0_8_;
    pp_Var20 = (this->super_ChLineShape).super_ChVisualShape._vptr_ChVisualShape;
  }
  else {
    pCVar22 = &local_78;
    ChTransform<double>::TransformParentToLocal
              ((ChVector<double> *)(*(long *)(lVar19 + 0xb8) + 0x250),&(frame->coord).pos,
               &frame->Amatrix);
    pCVar23 = &local_90;
    ChTransform<double>::TransformParentToLocal
              ((ChVector<double> *)(*(long *)(lVar19 + 0xc0) + 0x250),&(frame->coord).pos,
               &frame->Amatrix);
    pp_Var20 = (this->super_ChLineShape).super_ChVisualShape._vptr_ChVisualShape;
  }
LAB_00843db8:
  (*pp_Var20[5])(this,pCVar22,pCVar23);
  return;
}

Assistant:

void ChPointPointShape::Update(ChPhysicsItem* updater, const ChFrame<>& frame) {
    // Extract two positions from updater if it has any, and then update line geometry from these positions.
    if (auto link_markers = dynamic_cast<ChLinkMarkers*>(updater)) {
        UpdateLineGeometry(frame.TransformPointParentToLocal(link_markers->GetMarker1()->GetAbsCoord().pos),
                           frame.TransformPointParentToLocal(link_markers->GetMarker2()->GetAbsCoord().pos));
    } else if (auto link_dist = dynamic_cast<ChLinkDistance*>(updater)) {
        UpdateLineGeometry(frame.TransformPointParentToLocal(link_dist->GetEndPoint1Abs()),
                           frame.TransformPointParentToLocal(link_dist->GetEndPoint2Abs()));
    } else if (auto link_rs = dynamic_cast<ChLinkRevoluteSpherical*>(updater)) {
        UpdateLineGeometry(frame.TransformPointParentToLocal(link_rs->GetPoint1Abs()),
                           frame.TransformPointParentToLocal(link_rs->GetPoint2Abs()));
    } else if (auto link_tsda = dynamic_cast<ChLinkTSDA*>(updater)) {
        UpdateLineGeometry(frame.TransformPointParentToLocal(link_tsda->GetPoint1Abs()),
                           frame.TransformPointParentToLocal(link_tsda->GetPoint2Abs()));
    } else if (auto link_mate = dynamic_cast<ChLinkMateGeneric*>(updater)) {
        auto pt1 = link_mate->GetBody1()->TransformPointLocalToParent(link_mate->GetFrame1().GetPos());
        auto pt2 = link_mate->GetBody2()->TransformPointLocalToParent(link_mate->GetFrame2().GetPos());
        UpdateLineGeometry(frame.TransformPointParentToLocal(pt1), frame.TransformPointParentToLocal(pt2));
    } else if (auto link = dynamic_cast<ChLink*>(updater)) {
        UpdateLineGeometry(frame.TransformPointParentToLocal(link->GetBody1()->GetPos()),
                           frame.TransformPointParentToLocal(link->GetBody2()->GetPos()));
    }
}